

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzerResults.cpp
# Opt level: O3

void __thiscall
EnrichableI2cAnalyzerResults::GenerateExportFile
          (EnrichableI2cAnalyzerResults *this,char *file,DisplayBase display_base,U32 param_3)

{
  AddressDisplay AVar1;
  bool bVar2;
  uchar *puVar3;
  char cVar4;
  uint uVar5;
  void *pvVar6;
  long lVar7;
  size_t sVar8;
  ostream *poVar9;
  uint uVar10;
  ulonglong uVar11;
  ulonglong uVar12;
  ulong uVar13;
  char ack [32];
  Frame frame;
  char time [128];
  char rw [128];
  char data [128];
  char address [128];
  stringstream ss;
  uchar *local_438;
  char acStack_430 [32];
  ulong local_410;
  ulonglong local_408;
  ulonglong local_400 [2];
  byte local_3f0;
  undefined7 uStack_3ef;
  char local_3e0;
  byte local_3df;
  undefined1 *local_3d8;
  uint local_3d0;
  undefined1 local_3c8 [16];
  uchar *local_3b8;
  undefined8 local_3b0;
  uchar local_3a8 [112];
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 *local_2b8;
  uint auStack_2b0 [2];
  undefined1 local_2a8 [112];
  char local_238 [128];
  stringstream local_1b8 [16];
  long local_1a8;
  string local_1a0 [104];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pvVar6 = (void *)AnalyzerHelpers::StartFile(file,false);
  local_408 = Analyzer::GetTriggerSample();
  uVar5 = Analyzer::GetSampleRate();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Time [s],Packet ID,Address,Data,Read/Write,ACK/NAK",0x32);
  std::ios::widen((char)*(undefined8 *)(local_1a8 + -0x18) + (char)&local_1a8);
  std::ostream::put((char)&local_1a8);
  std::ostream::flush();
  local_238[0x70] = '\0';
  local_238[0x71] = '\0';
  local_238[0x72] = '\0';
  local_238[0x73] = '\0';
  local_238[0x74] = '\0';
  local_238[0x75] = '\0';
  local_238[0x76] = '\0';
  local_238[0x77] = '\0';
  local_238[0x78] = '\0';
  local_238[0x79] = '\0';
  local_238[0x7a] = '\0';
  local_238[0x7b] = '\0';
  local_238[0x7c] = '\0';
  local_238[0x7d] = '\0';
  local_238[0x7e] = '\0';
  local_238[0x7f] = '\0';
  local_238[0x60] = '\0';
  local_238[0x61] = '\0';
  local_238[0x62] = '\0';
  local_238[99] = '\0';
  local_238[100] = '\0';
  local_238[0x65] = '\0';
  local_238[0x66] = '\0';
  local_238[0x67] = '\0';
  local_238[0x68] = '\0';
  local_238[0x69] = '\0';
  local_238[0x6a] = '\0';
  local_238[0x6b] = '\0';
  local_238[0x6c] = '\0';
  local_238[0x6d] = '\0';
  local_238[0x6e] = '\0';
  local_238[0x6f] = '\0';
  local_238[0x50] = '\0';
  local_238[0x51] = '\0';
  local_238[0x52] = '\0';
  local_238[0x53] = '\0';
  local_238[0x54] = '\0';
  local_238[0x55] = '\0';
  local_238[0x56] = '\0';
  local_238[0x57] = '\0';
  local_238[0x58] = '\0';
  local_238[0x59] = '\0';
  local_238[0x5a] = '\0';
  local_238[0x5b] = '\0';
  local_238[0x5c] = '\0';
  local_238[0x5d] = '\0';
  local_238[0x5e] = '\0';
  local_238[0x5f] = '\0';
  local_238[0x40] = '\0';
  local_238[0x41] = '\0';
  local_238[0x42] = '\0';
  local_238[0x43] = '\0';
  local_238[0x44] = '\0';
  local_238[0x45] = '\0';
  local_238[0x46] = '\0';
  local_238[0x47] = '\0';
  local_238[0x48] = '\0';
  local_238[0x49] = '\0';
  local_238[0x4a] = '\0';
  local_238[0x4b] = '\0';
  local_238[0x4c] = '\0';
  local_238[0x4d] = '\0';
  local_238[0x4e] = '\0';
  local_238[0x4f] = '\0';
  local_238[0x30] = '\0';
  local_238[0x31] = '\0';
  local_238[0x32] = '\0';
  local_238[0x33] = '\0';
  local_238[0x34] = '\0';
  local_238[0x35] = '\0';
  local_238[0x36] = '\0';
  local_238[0x37] = '\0';
  local_238[0x38] = '\0';
  local_238[0x39] = '\0';
  local_238[0x3a] = '\0';
  local_238[0x3b] = '\0';
  local_238[0x3c] = '\0';
  local_238[0x3d] = '\0';
  local_238[0x3e] = '\0';
  local_238[0x3f] = '\0';
  local_238[0x20] = '\0';
  local_238[0x21] = '\0';
  local_238[0x22] = '\0';
  local_238[0x23] = '\0';
  local_238[0x24] = '\0';
  local_238[0x25] = '\0';
  local_238[0x26] = '\0';
  local_238[0x27] = '\0';
  local_238[0x28] = '\0';
  local_238[0x29] = '\0';
  local_238[0x2a] = '\0';
  local_238[0x2b] = '\0';
  local_238[0x2c] = '\0';
  local_238[0x2d] = '\0';
  local_238[0x2e] = '\0';
  local_238[0x2f] = '\0';
  local_238[0x10] = '\0';
  local_238[0x11] = '\0';
  local_238[0x12] = '\0';
  local_238[0x13] = '\0';
  local_238[0x14] = '\0';
  local_238[0x15] = '\0';
  local_238[0x16] = '\0';
  local_238[0x17] = '\0';
  local_238[0x18] = '\0';
  local_238[0x19] = '\0';
  local_238[0x1a] = '\0';
  local_238[0x1b] = '\0';
  local_238[0x1c] = '\0';
  local_238[0x1d] = '\0';
  local_238[0x1e] = '\0';
  local_238[0x1f] = '\0';
  local_238[0] = '\0';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  local_238[4] = '\0';
  local_238[5] = '\0';
  local_238[6] = '\0';
  local_238[7] = '\0';
  local_238[8] = '\0';
  local_238[9] = '\0';
  local_238[10] = '\0';
  local_238[0xb] = '\0';
  local_238[0xc] = '\0';
  local_238[0xd] = '\0';
  local_238[0xe] = '\0';
  local_238[0xf] = '\0';
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_308 = 0;
  uStack_300 = 0;
  local_318 = 0;
  uStack_310 = 0;
  local_328 = 0;
  uStack_320 = 0;
  local_338 = 0;
  uStack_330 = 0;
  local_410 = AnalyzerResults::GetNumFrames();
  if (local_410 != 0) {
    uVar11 = 0;
    uVar13 = 1;
    do {
      AnalyzerResults::GetFrame((ulonglong)local_400);
      if (local_3e0 == '\0') {
        AVar1 = this->mSettings->mAddressDisplay;
        if (AVar1 == NO_DIRECTION_7) {
          uVar12 = CONCAT71(uStack_3ef,local_3f0) >> 1;
          uVar10 = 7;
LAB_00109902:
          AnalyzerHelpers::GetNumberString(uVar12,display_base,uVar10,local_238,0x80);
        }
        else {
          if (AVar1 == NO_DIRECTION_8) {
            uVar12 = (ulonglong)((uint)CONCAT71(uStack_3ef,local_3f0) & 0xfe);
            uVar10 = 8;
            goto LAB_00109902;
          }
          if (AVar1 == YES_DIRECTION_8) {
            uVar10 = 8;
            uVar12 = CONCAT71(uStack_3ef,local_3f0);
            goto LAB_00109902;
          }
        }
        if ((local_3f0 & 1) == 0) {
          local_338 = CONCAT26(local_338._6_2_,0x6500000000);
          local_338 = CONCAT44(local_338._4_4_,0x74697257);
        }
        else {
          local_338._4_4_ = (uint)((ulong)local_338 >> 0x20) & 0xffffff00;
          local_338 = CONCAT44(local_338._4_4_,0x64616552);
        }
        if ((local_3df & 1) == 0) {
          if ((local_3df & 2) == 0) {
            local_2b8 = (undefined1 *)CONCAT44(local_2b8._4_4_,0x4b414e);
          }
          else {
            local_2b8 = (undefined1 *)0x20676e697373694d;
            auStack_2b0 = (uint  [2])0x4b414e2f4b4341;
          }
          AnalyzerHelpers::GetTimeString(local_400[0],local_408,uVar5,(char *)&local_3b8,0x80);
          sVar8 = strlen((char *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,(char *)&local_3b8,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",,",2);
          sVar8 = strlen(local_238);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,local_238,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"",0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",",1);
          sVar8 = strlen((char *)&local_338);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,(char *)&local_338,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",",1);
          sVar8 = strlen((char *)&local_2b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,(char *)&local_2b8,sVar8);
          cVar4 = (char)(ostream *)&local_1a8;
          std::ios::widen((char)*(undefined8 *)(local_1a8 + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          puVar3 = local_438;
          std::__cxx11::stringbuf::str();
          AnalyzerHelpers::AppendToFile(puVar3,local_3d0,pvVar6);
          if (local_3d8 != local_3c8) {
            operator_delete(local_3d8);
          }
          if (local_438 != (uchar *)(acStack_430 + 8)) {
            operator_delete(local_438);
          }
          acStack_430[0] = '\0';
          acStack_430[1] = '\0';
          acStack_430[2] = '\0';
          acStack_430[3] = '\0';
          acStack_430[4] = '\0';
          acStack_430[5] = '\0';
          acStack_430[6] = '\0';
          acStack_430[7] = '\0';
          acStack_430[8] = 0;
          local_438 = (uchar *)(acStack_430 + 8);
          std::__cxx11::stringbuf::str(local_1a0);
          if (local_438 != (uchar *)(acStack_430 + 8)) {
            operator_delete(local_438);
          }
        }
      }
      else {
        AnalyzerHelpers::GetTimeString(local_400[0],local_408,uVar5,(char *)&local_3b8,0x80);
        AnalyzerHelpers::GetNumberString
                  (CONCAT71(uStack_3ef,local_3f0),display_base,8,(char *)&local_2b8,0x80);
        if ((local_3df & 1) == 0) {
          if ((local_3df & 2) == 0) {
            local_438 = (uchar *)CONCAT44(local_438._4_4_,0x4b414e);
          }
          else {
            local_438 = (uchar *)0x20676e697373694d;
            builtin_strncpy(acStack_430,"ACK/NAK",8);
          }
        }
        else {
          local_438 = (uchar *)CONCAT44(local_438._4_4_,0x4b4341);
        }
        lVar7 = AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this);
        sVar8 = strlen((char *)&local_3b8);
        if (lVar7 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,(char *)&local_3b8,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",,",2);
          sVar8 = strlen(local_238);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,local_238,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",",1);
          sVar8 = strlen((char *)&local_2b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,(char *)&local_2b8,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",",1);
          sVar8 = strlen((char *)&local_338);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,(char *)&local_338,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",",1);
          sVar8 = strlen((char *)&local_438);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,(char *)&local_438,sVar8);
          std::ios::widen((char)*(undefined8 *)(local_1a8 + -0x18) + (char)&local_1a8);
          poVar9 = (ostream *)&local_1a8;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,(char *)&local_3b8,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",",1);
          poVar9 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
          sVar8 = strlen(local_238);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_238,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
          sVar8 = strlen((char *)&local_2b8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_2b8,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
          sVar8 = strlen((char *)&local_338);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_338,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
          sVar8 = strlen((char *)&local_438);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_438,sVar8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        }
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      std::__cxx11::stringbuf::str();
      puVar3 = local_3b8;
      std::__cxx11::stringbuf::str();
      AnalyzerHelpers::AppendToFile(puVar3,auStack_2b0[0],pvVar6);
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8);
      }
      if (local_3b8 != local_3a8) {
        operator_delete(local_3b8);
      }
      local_3b0 = 0;
      local_3a8[0] = '\0';
      local_3b8 = local_3a8;
      std::__cxx11::stringbuf::str(local_1a0);
      if (local_3b8 != local_3a8) {
        operator_delete(local_3b8);
      }
      cVar4 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar11);
      if (cVar4 != '\0') {
        AnalyzerHelpers::EndFile(pvVar6);
        Frame::~Frame((Frame *)local_400);
        goto LAB_00109c62;
      }
      Frame::~Frame((Frame *)local_400);
      bVar2 = uVar13 < local_410;
      uVar11 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar2);
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,local_410);
  AnalyzerHelpers::EndFile(pvVar6);
LAB_00109c62:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void EnrichableI2cAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 /*export_type_user_id*/ )
{
	//export_type_user_id is only important if we have more than one export type.

	std::stringstream ss;
	void* f = AnalyzerHelpers::StartFile( file );;

	U64 trigger_sample = mAnalyzer->GetTriggerSample();
	U32 sample_rate = mAnalyzer->GetSampleRate();

	ss << "Time [s],Packet ID,Address,Data,Read/Write,ACK/NAK" << std::endl;

	char address[128] = "";
	char rw[128] = "";
	U64 num_frames = GetNumFrames();
	for( U32 i=0; i < num_frames; i++ )
	{
		Frame frame = GetFrame( i );

		if( frame.mType == I2cAddress )
		{
			switch( mSettings->mAddressDisplay )
			{
			case NO_DIRECTION_7:
				AnalyzerHelpers::GetNumberString( frame.mData1 >> 1, display_base, 7, address, 128 );
				break;
			case NO_DIRECTION_8:
				AnalyzerHelpers::GetNumberString( frame.mData1 & 0xFE, display_base, 8, address, 128 );
				break;
			case YES_DIRECTION_8:
				AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, address, 128 );
				break;
			}
			if( ( frame.mData1 & 0x1 ) != 0 )
				snprintf( rw, sizeof(rw), "Read" );
			else
				snprintf( rw, sizeof(rw), "Write" );

			//check to see if the address packet is NAKed. If it is, we need to export the line here.
			if( ( frame.mFlags & I2C_FLAG_ACK ) == 0 )
			{
				char ack[32];
				if( (frame.mFlags & I2C_MISSING_FLAG_ACK) != 0 )
					snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
				else					
					snprintf( ack, sizeof( ack ), "NAK" );
				//we need to write out the line here.
				char time[128];
				AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time, 128 );

				ss << time << ",," << address << "," << "" << "," << rw << "," << ack << std::endl;
				AnalyzerHelpers::AppendToFile( ( U8* )ss.str( ).c_str( ), ss.str( ).length( ), f );
				ss.str( std::string( ) );
			}
				
		}
		else
		{
			char time[128];
			AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time, 128 );
			
			char data[128];
			AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, data, 128);

			char ack[32];
			if( ( frame.mFlags & I2C_FLAG_ACK ) != 0 )
				snprintf( ack, sizeof(ack), "ACK" );
			else if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
				snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
			else
				snprintf( ack, sizeof(ack), "NAK" );
				

			U64 packet_id = GetPacketContainingFrameSequential( i ); 
			if( packet_id != INVALID_RESULT_INDEX )
				ss << time << "," << packet_id << "," << address << "," << data << "," << rw << "," << ack << std::endl;
			else
				ss << time << ",," << address << "," << data << "," << rw << "," << ack << std::endl;
		}

		AnalyzerHelpers::AppendToFile( (U8*)ss.str().c_str(), ss.str().length(), f );
		ss.str( std::string() );
					
					
		if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
		{
			AnalyzerHelpers::EndFile( f );
			return;
		}
	}

	UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
	AnalyzerHelpers::EndFile( f );
}